

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Archiver_Inc.hpp
# Opt level: O3

void __thiscall
Diligent::SerializedPipelineStateImpl::
CreateDefaultResourceSignature<Diligent::PipelineStateVkImpl,Diligent::PipelineResourceSignatureVkImpl,std::vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>>>
          (SerializedPipelineStateImpl *this,DeviceType Type,PipelineStateDesc *PSODesc,
          SHADER_TYPE ActiveShaderStageFlags,
          vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
          *ShaderStages)

{
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *pRVar1;
  SerializedResourceSignatureImpl *pSVar2;
  char *__s;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> RVar3;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *pRVar4;
  PipelineResourceSignatureDescWrapper SignDesc;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> local_120;
  RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *local_118;
  PipelineResourceSignatureDescWrapper local_110;
  
  PipelineStateVkImpl::GetDefaultResourceSignatureDesc
            (&local_110,ShaderStages,(PSODesc->super_DeviceObjectAttribs).Name,
             &PSODesc->ResourceLayout,PSODesc->SRBAllocationGranularity);
  pRVar1 = &this->m_pDefaultSignature;
  pSVar2 = (this->m_pDefaultSignature).m_pObject;
  if (pSVar2 == (SerializedResourceSignatureImpl *)0x0) {
    local_120.m_pObject = (SerializedResourceSignatureImpl *)0x0;
    local_118 = pRVar1;
    SerializationDeviceImpl::CreateSerializedResourceSignature
              (this->m_pSerializationDevice,&local_120.m_pObject,
               local_110.m_Desc.super_DeviceObjectAttribs.Name);
    pRVar4 = local_118;
    RVar3.m_pObject = local_120.m_pObject;
    if ((local_118 != (RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl> *)0x0) &&
       (local_118->m_pObject != local_120.m_pObject)) {
      RefCntAutoPtr<Diligent::SerializedResourceSignatureImpl>::Release(local_118);
      pRVar4->m_pObject = RVar3.m_pObject;
    }
    if (pRVar1->m_pObject == (SerializedResourceSignatureImpl *)0x0) {
      LogError<true,char[54],char_const*,char[3]>
                (false,"CreateDefaultResourceSignature",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/Archiver/src/Archiver_Inc.hpp"
                 ,0x5e,(char (*) [54])"Failed to create default resource signature for PSO \'",
                 (char **)PSODesc,(char (*) [3])"\'.");
    }
  }
  else {
    __s = (pSVar2->m_Name)._M_dataplus._M_p;
    strlen(__s);
    std::__cxx11::string::_M_replace
              ((ulong)&local_110,0,(char *)local_110.m_Name._M_string_length,(ulong)__s);
    local_110.m_Desc.super_DeviceObjectAttribs.Name = local_110.m_Name._M_dataplus._M_p;
  }
  SerializedResourceSignatureImpl::CreateDeviceSignature<Diligent::PipelineResourceSignatureVkImpl>
            (pRVar1->m_pObject,Type,&local_110.m_Desc,ActiveShaderStageFlags);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_110.m_StringPool._M_h);
  if (local_110.m_ImmutableSamplers.
      super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.m_ImmutableSamplers.
                    super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.m_ImmutableSamplers.
                          super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.m_ImmutableSamplers.
                          super__Vector_base<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_110.m_Resources.
      super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.m_Resources.
                    super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.m_Resources.
                          super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.m_Resources.
                          super__Vector_base<Diligent::PipelineResourceDesc,_std::allocator<Diligent::PipelineResourceDesc>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_CombinedSamplerSuffix._M_dataplus._M_p !=
      &local_110.m_CombinedSamplerSuffix.field_2) {
    operator_delete(local_110.m_CombinedSamplerSuffix._M_dataplus._M_p,
                    local_110.m_CombinedSamplerSuffix.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110.m_Name._M_dataplus._M_p != &local_110.m_Name.field_2) {
    operator_delete(local_110.m_Name._M_dataplus._M_p,
                    local_110.m_Name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void SerializedPipelineStateImpl::CreateDefaultResourceSignature(DeviceType                   Type,
                                                                 const PipelineStateDesc&     PSODesc,
                                                                 SHADER_TYPE                  ActiveShaderStageFlags,
                                                                 const ShaderStagesArrayType& ShaderStages,
                                                                 const ExtraArgsType&... ExtraArgs)
{
    auto SignDesc = PipelineStateImplType::GetDefaultResourceSignatureDesc(ShaderStages, PSODesc.Name, PSODesc.ResourceLayout, PSODesc.SRBAllocationGranularity, ExtraArgs...);
    if (!m_pDefaultSignature)
    {
        // Create empty serialized signature
        m_pSerializationDevice->CreateSerializedResourceSignature(&m_pDefaultSignature, SignDesc.Get().Name);
        if (!m_pDefaultSignature)
            LOG_ERROR_AND_THROW("Failed to create default resource signature for PSO '", PSODesc.Name, "'.");
    }
    else
    {
        // Override the name to make sure it is consistent for all devices
        SignDesc.SetName(m_pDefaultSignature->GetName());
    }

    m_pDefaultSignature->CreateDeviceSignature<SignatureImplType>(Type, SignDesc, ActiveShaderStageFlags);
}